

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.hpp
# Opt level: O2

int glu::getDataTypeNumLocations(DataType dataType)

{
  int iVar1;
  
  if (dataType - TYPE_FLOAT < 0x22) {
    if ((3 < dataType - TYPE_BOOL &
        ((byte)(0x3fc01e00f >> ((byte)(dataType - TYPE_FLOAT) & 0x3f)) ^ 1)) != 0) {
LAB_0153e754:
      if (8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) {
        return 0;
      }
      iVar1 = getDataTypeMatrixNumColumns(dataType);
      return iVar1;
    }
  }
  else if (3 < dataType - TYPE_BOOL) goto LAB_0153e754;
  return 1;
}

Assistant:

inline bool		isDataTypeScalarOrVector	(DataType dataType) { return deInRange32(dataType, TYPE_FLOAT, TYPE_FLOAT_VEC4) || deInRange32(dataType, TYPE_DOUBLE, TYPE_DOUBLE_VEC4) || deInRange32(dataType, TYPE_INT, TYPE_INT_VEC4) || deInRange32(dataType, TYPE_UINT, TYPE_UINT_VEC4) || deInRange32(dataType, TYPE_BOOL, TYPE_BOOL_VEC4); }